

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.cpp
# Opt level: O2

void graphics101::bind_textures(TextureVec *textures)

{
  long *plVar1;
  int index;
  ulong uVar2;
  long lVar3;
  
  lVar3 = 0;
  for (uVar2 = 0;
      uVar2 < (ulong)((long)(textures->
                            super__Vector_base<std::shared_ptr<graphics101::Texture>,_std::allocator<std::shared_ptr<graphics101::Texture>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(textures->
                            super__Vector_base<std::shared_ptr<graphics101::Texture>,_std::allocator<std::shared_ptr<graphics101::Texture>_>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 4); uVar2 = uVar2 + 1) {
    (*gl3wProcs.ptr[1])((ulong)((int)uVar2 + 0x84c0));
    plVar1 = *(long **)((long)&(((textures->
                                 super__Vector_base<std::shared_ptr<graphics101::Texture>,_std::allocator<std::shared_ptr<graphics101::Texture>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start)->
                               super___shared_ptr<graphics101::Texture,_(__gnu_cxx::_Lock_policy)2>)
                               ._M_ptr + lVar3);
    if (plVar1 == (long *)0x0) {
      std::operator<<((ostream *)&std::cerr,"No texture\n");
    }
    else {
      (**(code **)(*plVar1 + 0x10))();
    }
    lVar3 = lVar3 + 0x10;
  }
  return;
}

Assistant:

void bind_textures( const TextureVec& textures ) {
    for( int index = 0; index < textures.size(); ++index ) {
        glActiveTexture( GL_TEXTURE0 + index );
        
        // We will have a null pointer if bindable_textures was called
        // with an unknown name.
        if( !textures[index] ) {
            cerr << "No texture\n";
            continue;
        }
        
        textures[index]->bind();
    }
}